

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlBufDumpAttributeDecl(xmlOutputBufferPtr buf,xmlAttributePtr attr)

{
  xmlAttributePtr attr_local;
  xmlOutputBufferPtr buf_local;
  
  xmlOutputBufferWrite(buf,10,"<!ATTLIST ");
  xmlOutputBufferWriteString(buf,(char *)attr->elem);
  xmlOutputBufferWrite(buf,1," ");
  if (attr->prefix != (xmlChar *)0x0) {
    xmlOutputBufferWriteString(buf,(char *)attr->prefix);
    xmlOutputBufferWrite(buf,1,":");
  }
  xmlOutputBufferWriteString(buf,(char *)attr->name);
  switch(attr->atype) {
  case XML_ATTRIBUTE_CDATA:
    xmlOutputBufferWrite(buf,6," CDATA");
    break;
  case XML_ATTRIBUTE_ID:
    xmlOutputBufferWrite(buf,3," ID");
    break;
  case XML_ATTRIBUTE_IDREF:
    xmlOutputBufferWrite(buf,6," IDREF");
    break;
  case XML_ATTRIBUTE_IDREFS:
    xmlOutputBufferWrite(buf,7," IDREFS");
    break;
  case XML_ATTRIBUTE_ENTITY:
    xmlOutputBufferWrite(buf,7," ENTITY");
    break;
  case XML_ATTRIBUTE_ENTITIES:
    xmlOutputBufferWrite(buf,9," ENTITIES");
    break;
  case XML_ATTRIBUTE_NMTOKEN:
    xmlOutputBufferWrite(buf,8," NMTOKEN");
    break;
  case XML_ATTRIBUTE_NMTOKENS:
    xmlOutputBufferWrite(buf,9," NMTOKENS");
    break;
  case XML_ATTRIBUTE_ENUMERATION:
    xmlOutputBufferWrite(buf,2," (");
    xmlBufDumpEnumeration(buf,attr->tree);
    break;
  case XML_ATTRIBUTE_NOTATION:
    xmlOutputBufferWrite(buf,0xb," NOTATION (");
    xmlBufDumpEnumeration(buf,attr->tree);
  }
  switch(attr->def) {
  case XML_ATTRIBUTE_NONE:
    break;
  case XML_ATTRIBUTE_REQUIRED:
    xmlOutputBufferWrite(buf,10," #REQUIRED");
    break;
  case XML_ATTRIBUTE_IMPLIED:
    xmlOutputBufferWrite(buf,9," #IMPLIED");
    break;
  case XML_ATTRIBUTE_FIXED:
    xmlOutputBufferWrite(buf,7," #FIXED");
  }
  if (attr->defaultValue != (xmlChar *)0x0) {
    xmlOutputBufferWrite(buf,1," ");
    xmlOutputBufferWriteQuotedString(buf,attr->defaultValue);
  }
  xmlOutputBufferWrite(buf,2,">\n");
  return;
}

Assistant:

static void
xmlBufDumpAttributeDecl(xmlOutputBufferPtr buf, xmlAttributePtr attr) {
    xmlOutputBufferWrite(buf, 10, "<!ATTLIST ");
    xmlOutputBufferWriteString(buf, (const char *) attr->elem);
    xmlOutputBufferWrite(buf, 1, " ");
    if (attr->prefix != NULL) {
	xmlOutputBufferWriteString(buf, (const char *) attr->prefix);
	xmlOutputBufferWrite(buf, 1, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *) attr->name);

    switch (attr->atype) {
	case XML_ATTRIBUTE_CDATA:
	    xmlOutputBufferWrite(buf, 6, " CDATA");
	    break;
	case XML_ATTRIBUTE_ID:
	    xmlOutputBufferWrite(buf, 3, " ID");
	    break;
	case XML_ATTRIBUTE_IDREF:
	    xmlOutputBufferWrite(buf, 6, " IDREF");
	    break;
	case XML_ATTRIBUTE_IDREFS:
	    xmlOutputBufferWrite(buf, 7, " IDREFS");
	    break;
	case XML_ATTRIBUTE_ENTITY:
	    xmlOutputBufferWrite(buf, 7, " ENTITY");
	    break;
	case XML_ATTRIBUTE_ENTITIES:
	    xmlOutputBufferWrite(buf, 9, " ENTITIES");
	    break;
	case XML_ATTRIBUTE_NMTOKEN:
	    xmlOutputBufferWrite(buf, 8, " NMTOKEN");
	    break;
	case XML_ATTRIBUTE_NMTOKENS:
	    xmlOutputBufferWrite(buf, 9, " NMTOKENS");
	    break;
	case XML_ATTRIBUTE_ENUMERATION:
	    xmlOutputBufferWrite(buf, 2, " (");
	    xmlBufDumpEnumeration(buf, attr->tree);
	    break;
	case XML_ATTRIBUTE_NOTATION:
	    xmlOutputBufferWrite(buf, 11, " NOTATION (");
	    xmlBufDumpEnumeration(buf, attr->tree);
	    break;
	default:
            /* assert(0); */
            break;
    }

    switch (attr->def) {
	case XML_ATTRIBUTE_NONE:
	    break;
	case XML_ATTRIBUTE_REQUIRED:
	    xmlOutputBufferWrite(buf, 10, " #REQUIRED");
	    break;
	case XML_ATTRIBUTE_IMPLIED:
	    xmlOutputBufferWrite(buf, 9, " #IMPLIED");
	    break;
	case XML_ATTRIBUTE_FIXED:
	    xmlOutputBufferWrite(buf, 7, " #FIXED");
	    break;
	default:
            /* assert(0); */
            break;
    }

    if (attr->defaultValue != NULL) {
	xmlOutputBufferWrite(buf, 1, " ");
	xmlOutputBufferWriteQuotedString(buf, attr->defaultValue);
    }

    xmlOutputBufferWrite(buf, 2, ">\n");
}